

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

QList<std::pair<QString,_QString>_> * __thiscall
QUrlQuery::queryItems
          (QList<std::pair<QString,_QString>_> *__return_storage_ptr__,QUrlQuery *this,
          ComponentFormattingOptions encoding)

{
  QUrlQueryPrivate *pQVar1;
  long asize;
  Data *pDVar2;
  pair<QString,_QString> *ppVar3;
  pair<QString,_QString> *input;
  long in_FS_OFFSET;
  QString local_a8;
  QString local_88;
  pair<QString,_QString> local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QUrlQueryPrivate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00266865;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (pair<QString,_QString> *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if ((QFlagsStorage<QUrl::ComponentFormattingOption>)
        encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
        super_QFlagsStorage<QUrl::ComponentFormattingOption>.i ==
        (QFlagsStorage<QUrl::ComponentFormattingOption>)0x0) {
      pDVar2 = (pQVar1->itemList).d.d;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = (pQVar1->itemList).d.ptr;
      (__return_storage_ptr__->d).size = (pQVar1->itemList).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (pair<QString,_QString> *)0x0;
      (__return_storage_ptr__->d).size = 0;
      input = (pQVar1->itemList).d.ptr;
      asize = (pQVar1->itemList).d.size;
      QList<std::pair<QString,_QString>_>::reserve(__return_storage_ptr__,asize);
      if (asize != 0) {
        ppVar3 = input + asize;
        do {
          QUrlQueryPrivate::recodeToUser(&local_88,(this->d).d.ptr,&input->first,encoding);
          QUrlQueryPrivate::recodeToUser(&local_a8,(this->d).d.ptr,&input->second,encoding);
          local_68.first.d.size = local_88.d.size;
          local_68.first.d.ptr = local_88.d.ptr;
          local_68.first.d.d = local_88.d.d;
          local_68.second.d.size = local_a8.d.size;
          local_68.second.d.ptr = local_a8.d.ptr;
          local_68.second.d.d = local_a8.d.d;
          local_88.d.d = (Data *)0x0;
          local_88.d.ptr = (char16_t *)0x0;
          local_88.d.size = 0;
          local_a8.d.d = (Data *)0x0;
          local_a8.d.ptr = (char16_t *)0x0;
          local_a8.d.size = 0;
          QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::
          emplace<std::pair<QString,QString>>
                    ((QMovableArrayOps<std::pair<QString,QString>> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&local_68);
          QList<std::pair<QString,_QString>_>::end(__return_storage_ptr__);
          if (&(local_68.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_68.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_68.second.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_68.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_68.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_68.first.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
            }
          }
          input = input + 1;
        } while (input != ppVar3);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00266865:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<std::pair<QString, QString> > QUrlQuery::queryItems(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QList<std::pair<QString, QString> >();
    if (idempotentRecodeToUser(encoding))
        return d->itemList;

    QList<std::pair<QString, QString> > result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();
    result.reserve(d->itemList.size());
    for ( ; it != end; ++it)
        result << std::make_pair(d->recodeToUser(it->first, encoding),
                                 d->recodeToUser(it->second, encoding));
    return result;
}